

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

bool __thiscall
wasm::anon_unknown_18::FunctionInfo::worthFullInlining(FunctionInfo *this,PassOptions *options)

{
  byte bVar1;
  uint uVar2;
  
  if (this->hasTryDelegate == false) {
    bVar1 = 1;
    if (this->size <= (options->inlining).alwaysInlineMaxSize) goto LAB_008e407a;
    if ((this->refs).super___atomic_base<unsigned_int>._M_i == 1) {
      uVar2 = this->size;
      if ((this->usedGlobally == false) && (uVar2 <= (options->inlining).oneCallerInlineMaxSize))
      goto LAB_008e407a;
    }
    else {
      uVar2 = this->size;
    }
    if (uVar2 <= (options->inlining).flexibleInlineMaxSize) {
      bVar1 = 0;
      if ((options->shrinkLevel < 1) && (2 < options->optimizeLevel)) {
        if (this->hasCalls == true) {
          bVar1 = this->isTrivialCall;
        }
        else {
          bVar1 = this->hasLoops ^ 1U | (options->inlining).allowFunctionsWithLoops;
        }
      }
      goto LAB_008e407a;
    }
  }
  bVar1 = 0;
LAB_008e407a:
  return (bool)(bVar1 & 1);
}

Assistant:

bool worthFullInlining(PassOptions& options) {
    // Until we have proper support for try-delegate, ignore such functions.
    // FIXME https://github.com/WebAssembly/binaryen/issues/3634
    if (hasTryDelegate) {
      return false;
    }
    // If it's small enough that we always want to inline such things, do so.
    if (size <= options.inlining.alwaysInlineMaxSize) {
      return true;
    }
    // If it has one use, then inlining it would likely reduce code size, at
    // least for reasonable function sizes.
    if (refs == 1 && !usedGlobally &&
        size <= options.inlining.oneCallerInlineMaxSize) {
      return true;
    }
    // If it's so big that we have no flexible options that could allow it,
    // do not inline.
    if (size > options.inlining.flexibleInlineMaxSize) {
      return false;
    }
    // More than one use, so we can't eliminate it after inlining, and inlining
    // it will hurt code size. Stop if we are focused on size or not heavily
    // focused on speed.
    if (options.shrinkLevel > 0 || options.optimizeLevel < 3) {
      return false;
    }
    if (hasCalls) {
      // This has calls. If it is just a trivial call itself then inline, as we
      // will save a call that way - basically we skip a trampoline in the
      // middle - but if it is something more complex, leave it alone, as we may
      // not help much (and with recursion we may end up with a wasteful
      // increase in code size).
      //
      // Note that inlining trivial calls may increase code size, e.g. if they
      // use a parameter more than once (forcing us after inlining to save that
      // value to a local, etc.), but here we are optimizing for speed and not
      // size, so we risk it.
      return isTrivialCall;
    }
    // This doesn't have calls. Inline if loops do not prevent us (normally, a
    // loop suggests a lot of work and so inlining is less useful).
    return !hasLoops || options.inlining.allowFunctionsWithLoops;
  }